

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O0

void __thiscall
lunasvg::SVGTextFragmentsBuilder::build(SVGTextFragmentsBuilder *this,SVGTextElement *textElement)

{
  float fVar1;
  bool bVar2;
  LengthAdjust LVar3;
  bool bVar4;
  uint uVar5;
  reference pSVar6;
  SVGElement *node;
  size_type sVar7;
  mapped_type *__src;
  reference pSVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  bool local_18b;
  bool local_189;
  SVGTextFragment *fragment_1;
  iterator end;
  iterator begin;
  iterator it;
  int local_138;
  bool startsNewTextChunk;
  float fStack_134;
  bool shouldStartNewFragment;
  int local_130;
  float dy;
  int local_128;
  float dx;
  undefined1 local_120 [4];
  float angle;
  SVGCharacterPosition characterPosition;
  float lastAngle;
  bool didStartTextFragment;
  size_t textOffset;
  size_t startOffset;
  float baselineOffset;
  bool needsTextLengthSpacing;
  anon_class_32_4_9842c69d recordTextFragment;
  SVGTextFragment fragment;
  SVGTextPositioningElement *element;
  SVGTextPosition *textPosition;
  iterator __end1_1;
  iterator __begin1_1;
  SVGTextPositionList *__range1_1;
  u32string_view wholeText;
  SVGTextPosition *position;
  iterator __end1;
  iterator __begin1;
  SVGTextPositionList *__range1;
  SVGTextElement *textElement_local;
  SVGTextFragmentsBuilder *this_local;
  
  handleElement(this,&textElement->super_SVGTextPositioningElement);
  __end1 = std::vector<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>::begin
                     (&this->m_textPositions);
  position = (SVGTextPosition *)
             std::vector<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>::end
                       (&this->m_textPositions);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<lunasvg::SVGTextPosition_*,_std::vector<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>_>
                                     *)&position), bVar2) {
    wholeText._M_str =
         (char32_t *)
         __gnu_cxx::
         __normal_iterator<lunasvg::SVGTextPosition_*,_std::vector<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>_>
         ::operator*(&__end1);
    fillCharacterPositions(this,(SVGTextPosition *)wholeText._M_str);
    __gnu_cxx::
    __normal_iterator<lunasvg::SVGTextPosition_*,_std::vector<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>_>
    ::operator++(&__end1);
  }
  ___range1_1 = std::__cxx11::u32string::operator_cast_to_basic_string_view
                          ((u32string *)this->m_text);
  __end1_1 = std::vector<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>::begin
                       (&this->m_textPositions);
  textPosition = (SVGTextPosition *)
                 std::vector<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>::
                 end(&this->m_textPositions);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<lunasvg::SVGTextPosition_*,_std::vector<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>_>
                        *)&textPosition);
    if (!bVar2) {
      bVar2 = std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>::
              empty(this->m_fragments);
      if (!bVar2) {
        begin = std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>::
                begin(this->m_fragments);
        end = std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>::
              begin(this->m_fragments);
        fragment_1 = (SVGTextFragment *)
                     std::
                     vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>::
                     end(this->m_fragments);
        __gnu_cxx::
        __normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
        ::operator++(&begin);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&begin,(__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                                          *)&fragment_1), bVar2) {
          pSVar8 = __gnu_cxx::
                   __normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                   ::operator*(&begin);
          if ((pSVar8->startsNewTextChunk & 1U) != 0) {
            handleTextChunk((SVGTextFragmentIterator)end._M_current,
                            (SVGTextFragmentIterator)begin._M_current);
            end = begin;
          }
          __gnu_cxx::
          __normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
          ::operator++(&begin);
        }
        handleTextChunk((SVGTextFragmentIterator)end._M_current,
                        (SVGTextFragmentIterator)begin._M_current);
      }
      return;
    }
    pSVar6 = __gnu_cxx::
             __normal_iterator<lunasvg::SVGTextPosition_*,_std::vector<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>_>
             ::operator*(&__end1_1);
    uVar5 = (*pSVar6->node->_vptr_SVGNode[2])();
    if ((uVar5 & 1) != 0) {
      node = SVGNode::parentElement(pSVar6->node);
      fragment._64_8_ = toSVGTextPositioningElement(&node->super_SVGNode);
      SVGTextFragment::SVGTextFragment
                ((SVGTextFragment *)&recordTextFragment.this,
                 (SVGTextPositioningElement *)fragment._64_8_);
      _baselineOffset = &__range1_1;
      recordTextFragment.wholeText = (u32string_view *)&recordTextFragment.this;
      recordTextFragment.fragment = (SVGTextFragment *)&fragment.startsNewTextChunk;
      recordTextFragment.element = (SVGTextPositioningElement **)this;
      LVar3 = SVGTextPositioningElement::lengthAdjust((SVGTextPositioningElement *)fragment._64_8_);
      local_189 = false;
      if (LVar3 == Spacing) {
        local_189 = SVGElement::hasAttribute((SVGElement *)fragment._64_8_,TextLength);
      }
      fVar9 = calculateBaselineOffset((SVGTextPositioningElement *)fragment._64_8_);
      textOffset = pSVar6->startOffset;
      _lastAngle = pSVar6->startOffset;
      characterPosition.rotate.super__Optional_base<float,_true,_true>._M_payload.
      super__Optional_payload_base<float>._7_1_ = 0;
      characterPosition.rotate.super__Optional_base<float,_true,_true>._M_payload.
      super__Optional_payload_base<float>._M_payload._M_value = 0.0;
      while (_lastAngle < pSVar6->endOffset) {
        SVGCharacterPosition::SVGCharacterPosition((SVGCharacterPosition *)local_120);
        sVar7 = std::
                map<unsigned_long,_lunasvg::SVGCharacterPosition,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_lunasvg::SVGCharacterPosition>_>_>
                ::count(&this->m_characterPositions,&this->m_characterOffset);
        if (sVar7 != 0) {
          __src = std::
                  map<unsigned_long,_lunasvg::SVGCharacterPosition,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_lunasvg::SVGCharacterPosition>_>_>
                  ::at(&this->m_characterPositions,&this->m_characterOffset);
          memcpy(local_120,__src,0x28);
        }
        local_128 = 0;
        dx = std::optional<float>::value_or<int>(&characterPosition.dy,&local_128);
        local_130 = 0;
        dy = std::optional<float>::value_or<int>(&characterPosition.y,&local_130);
        local_138 = 0;
        fStack_134 = std::optional<float>::value_or<int>(&characterPosition.dx,&local_138);
        bVar2 = true;
        if (local_189 == false) {
          bVar4 = std::optional::operator_cast_to_bool((optional *)local_120);
          bVar2 = true;
          if (!bVar4) {
            bVar4 = std::optional::operator_cast_to_bool((optional *)&characterPosition);
            bVar2 = true;
            if (!bVar4) {
              bVar2 = true;
              if ((dy == 0.0) && (!NAN(dy))) {
                bVar2 = true;
                if ((fStack_134 == 0.0) && (!NAN(fStack_134))) {
                  bVar2 = true;
                  if ((dx == 0.0) && (!NAN(dx))) {
                    bVar2 = dx != characterPosition.rotate.super__Optional_base<float,_true,_true>.
                                  _M_payload.super__Optional_payload_base<float>._M_payload._M_value
                    ;
                  }
                }
              }
            }
          }
        }
        if ((bVar2) &&
           ((characterPosition.rotate.super__Optional_base<float,_true,_true>._M_payload.
             super__Optional_payload_base<float>._7_1_ & 1) != 0)) {
          build(lunasvg::SVGTextElement_const*)::$_0::operator()
                    (&baselineOffset,textOffset,_lastAngle);
          textOffset = _lastAngle;
        }
        bVar4 = std::optional::operator_cast_to_bool((optional *)local_120);
        if (bVar4) {
LAB_0014d2a7:
          local_18b = _lastAngle == pSVar6->startOffset;
        }
        else {
          bVar4 = std::optional::operator_cast_to_bool((optional *)&characterPosition);
          local_18b = false;
          if (bVar4) goto LAB_0014d2a7;
        }
        fVar11 = dy;
        if (((local_18b != false) || (bVar2)) ||
           ((characterPosition.rotate.super__Optional_base<float,_true,_true>._M_payload.
             super__Optional_payload_base<float>._7_1_ & 1) == 0)) {
          fVar10 = std::optional<float>::value_or<float&>((optional<float> *)local_120,&this->m_x);
          fVar1 = fStack_134;
          this->m_x = fVar11 + fVar10;
          fVar11 = std::optional<float>::value_or<float&>(&characterPosition.x,&this->m_y);
          this->m_y = fVar1 + fVar11;
          fragment.length._0_4_ = this->m_x;
          fragment.length._4_4_ = this->m_y - fVar9;
          fragment.x = dx;
          fragment.angle._0_1_ = local_18b;
          characterPosition.rotate.super__Optional_base<float,_true,_true>._M_payload.
          super__Optional_payload_base<float>._7_1_ = 1;
        }
        characterPosition.rotate.super__Optional_base<float,_true,_true>._M_payload.
        super__Optional_payload_base<float>._M_payload._M_value = dx;
        _lastAngle = _lastAngle + 1;
        this->m_characterOffset = this->m_characterOffset + 1;
      }
      build(lunasvg::SVGTextElement_const*)::$_0::operator()(&baselineOffset,textOffset,_lastAngle);
    }
    __gnu_cxx::
    __normal_iterator<lunasvg::SVGTextPosition_*,_std::vector<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>_>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

void SVGTextFragmentsBuilder::build(const SVGTextElement* textElement)
{
    handleElement(textElement);
    for(const auto& position : m_textPositions) {
        fillCharacterPositions(position);
    }

    std::u32string_view wholeText(m_text);
    for(const auto& textPosition : m_textPositions) {
        if(!textPosition.node->isTextNode())
            continue;
        auto element = toSVGTextPositioningElement(textPosition.node->parentElement());
        SVGTextFragment fragment(element);
        auto recordTextFragment = [&](auto startOffset, auto endOffset) {
            auto text = wholeText.substr(startOffset, endOffset - startOffset);
            fragment.offset = startOffset;
            fragment.length = text.length();
            fragment.width = element->font().measureText(text);
            m_fragments.push_back(fragment);
            m_x += fragment.width;
        };

        auto needsTextLengthSpacing = element->lengthAdjust() == LengthAdjust::Spacing && element->hasAttribute(PropertyID::TextLength);
        auto baselineOffset = calculateBaselineOffset(element);
        auto startOffset = textPosition.startOffset;
        auto textOffset = textPosition.startOffset;
        auto didStartTextFragment = false;
        auto lastAngle = 0.f;
        while(textOffset < textPosition.endOffset) {
            SVGCharacterPosition characterPosition;
            if(m_characterPositions.count(m_characterOffset) > 0) {
                characterPosition = m_characterPositions.at(m_characterOffset);
            }

            auto angle = characterPosition.rotate.value_or(0);
            auto dx = characterPosition.dx.value_or(0);
            auto dy = characterPosition.dy.value_or(0);

            auto shouldStartNewFragment = needsTextLengthSpacing || characterPosition.x || characterPosition.y || dx || dy || angle || angle != lastAngle;
            if(shouldStartNewFragment && didStartTextFragment) {
                recordTextFragment(startOffset, textOffset);
                startOffset = textOffset;
            }

            auto startsNewTextChunk = (characterPosition.x || characterPosition.y) && textOffset == textPosition.startOffset;
            if(startsNewTextChunk || shouldStartNewFragment || !didStartTextFragment) {
                m_x = dx + characterPosition.x.value_or(m_x);
                m_y = dy + characterPosition.y.value_or(m_y);
                fragment.x = m_x;
                fragment.y = m_y - baselineOffset;
                fragment.angle = angle;
                fragment.startsNewTextChunk = startsNewTextChunk;
                didStartTextFragment = true;
            }

            lastAngle = angle;
            ++textOffset;
            ++m_characterOffset;
        }

        recordTextFragment(startOffset, textOffset);
    }

    if(m_fragments.empty())
        return;
    auto it = m_fragments.begin();
    auto begin = m_fragments.begin();
    auto end = m_fragments.end();
    for(++it; it != end; ++it) {
        const SVGTextFragment& fragment = *it;
        if(!fragment.startsNewTextChunk)
            continue;
        handleTextChunk(begin, it);
        begin = it;
    }

    handleTextChunk(begin, it);
}